

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keyboard.cpp
# Opt level: O0

uint16_t __thiscall MSX::KeyboardMapper::mapped_key_for_key(KeyboardMapper *this,Key key)

{
  Key key_local;
  KeyboardMapper *this_local;
  
  switch(key) {
  case Escape:
    this_local._6_2_ = 0x72;
    break;
  case F1:
    this_local._6_2_ = 0x65;
    break;
  case F2:
    this_local._6_2_ = 0x66;
    break;
  case F3:
    this_local._6_2_ = 0x67;
    break;
  case F4:
    this_local._6_2_ = 0x70;
    break;
  case F5:
    this_local._6_2_ = 0x71;
    break;
  default:
    this_local._6_2_ = 0xfffe;
    break;
  case F8:
    this_local._6_2_ = 0x81;
    break;
  case F9:
    this_local._6_2_ = 0x82;
    break;
  case F10:
    this_local._6_2_ = 0x83;
    break;
  case F12:
    this_local._6_2_ = 0x74;
    break;
  case BackTick:
    this_local._6_2_ = 0x21;
    break;
  case k1:
    this_local._6_2_ = 1;
    break;
  case k2:
    this_local._6_2_ = 2;
    break;
  case k3:
    this_local._6_2_ = 3;
    break;
  case k4:
    this_local._6_2_ = 4;
    break;
  case k5:
    this_local._6_2_ = 5;
    break;
  case k6:
    this_local._6_2_ = 6;
    break;
  case k7:
    this_local._6_2_ = 7;
    break;
  case k8:
    this_local._6_2_ = 0x10;
    break;
  case k9:
    this_local._6_2_ = 0x11;
    break;
  case k0:
    this_local._6_2_ = 0;
    break;
  case Hyphen:
    this_local._6_2_ = 0x12;
    break;
  case Equals:
    this_local._6_2_ = 0x13;
    break;
  case Backspace:
    this_local._6_2_ = 0x75;
    break;
  case Tab:
    this_local._6_2_ = 0x73;
    break;
  case Q:
    this_local._6_2_ = 0x46;
    break;
  case W:
    this_local._6_2_ = 0x54;
    break;
  case E:
    this_local._6_2_ = 0x32;
    break;
  case R:
    this_local._6_2_ = 0x47;
    break;
  case T:
    this_local._6_2_ = 0x51;
    break;
  case Y:
    this_local._6_2_ = 0x56;
    break;
  case U:
    this_local._6_2_ = 0x52;
    break;
  case I:
    this_local._6_2_ = 0x36;
    break;
  case O:
    this_local._6_2_ = 0x44;
    break;
  case P:
    this_local._6_2_ = 0x45;
    break;
  case OpenSquareBracket:
    this_local._6_2_ = 0x15;
    break;
  case CloseSquareBracket:
    this_local._6_2_ = 0x16;
    break;
  case Backslash:
    this_local._6_2_ = 0x14;
    break;
  case CapsLock:
    this_local._6_2_ = 99;
    break;
  case A:
    this_local._6_2_ = 0x26;
    break;
  case S:
    this_local._6_2_ = 0x50;
    break;
  case D:
    this_local._6_2_ = 0x31;
    break;
  case F:
    this_local._6_2_ = 0x33;
    break;
  case G:
    this_local._6_2_ = 0x34;
    break;
  case H:
    this_local._6_2_ = 0x35;
    break;
  case J:
    this_local._6_2_ = 0x37;
    break;
  case K:
    this_local._6_2_ = 0x40;
    break;
  case L:
    this_local._6_2_ = 0x41;
    break;
  case Semicolon:
    this_local._6_2_ = 0x17;
    break;
  case Quote:
    this_local._6_2_ = 0x20;
    break;
  case Enter:
    this_local._6_2_ = 0x77;
    break;
  case LeftShift:
    this_local._6_2_ = 0x60;
    break;
  case Z:
    this_local._6_2_ = 0x57;
    break;
  case X:
    this_local._6_2_ = 0x55;
    break;
  case C:
    this_local._6_2_ = 0x30;
    break;
  case V:
    this_local._6_2_ = 0x53;
    break;
  case B:
    this_local._6_2_ = 0x27;
    break;
  case N:
    this_local._6_2_ = 0x43;
    break;
  case M:
    this_local._6_2_ = 0x42;
    break;
  case Comma:
    this_local._6_2_ = 0x22;
    break;
  case FullStop:
    this_local._6_2_ = 0x23;
    break;
  case ForwardSlash:
    this_local._6_2_ = 0x24;
    break;
  case RightShift:
    this_local._6_2_ = 0x60;
    break;
  case LeftControl:
    this_local._6_2_ = 0x61;
    break;
  case LeftOption:
    this_local._6_2_ = 100;
    break;
  case LeftMeta:
    this_local._6_2_ = 100;
    break;
  case Space:
    this_local._6_2_ = 0x80;
    break;
  case RightMeta:
    this_local._6_2_ = 0x62;
    break;
  case RightOption:
    this_local._6_2_ = 0x76;
    break;
  case RightControl:
    this_local._6_2_ = 0x61;
    break;
  case Left:
    this_local._6_2_ = 0x84;
    break;
  case Right:
    this_local._6_2_ = 0x87;
    break;
  case Up:
    this_local._6_2_ = 0x85;
    break;
  case Down:
    this_local._6_2_ = 0x86;
    break;
  case Insert:
    this_local._6_2_ = 0x82;
    break;
  case Home:
    this_local._6_2_ = 0x81;
    break;
  case Delete:
    this_local._6_2_ = 0x83;
  }
  return this_local._6_2_;
}

Assistant:

uint16_t MSX::KeyboardMapper::mapped_key_for_key(Inputs::Keyboard::Key key) const {
#define BIND(source, dest)	case Inputs::Keyboard::Key::source:	return MSX::Key::dest
	switch(key) {
		BIND(k0, Key0);		BIND(k1, Key1);		BIND(k2, Key2);		BIND(k3, Key3);		BIND(k4, Key4);
		BIND(k5, Key5);		BIND(k6, Key6);		BIND(k7, Key7);		BIND(k8, Key8);		BIND(k9, Key9);
		BIND(Q, KeyQ);		BIND(W, KeyW);		BIND(E, KeyE);		BIND(R, KeyR);		BIND(T, KeyT);
		BIND(Y, KeyY);		BIND(U, KeyU);		BIND(I, KeyI);		BIND(O, KeyO);		BIND(P, KeyP);
		BIND(A, KeyA);		BIND(S, KeyS);		BIND(D, KeyD);		BIND(F, KeyF);		BIND(G, KeyG);
		BIND(H, KeyH);		BIND(J, KeyJ);		BIND(K, KeyK);		BIND(L, KeyL);
		BIND(Z, KeyZ);		BIND(X, KeyX);		BIND(C, KeyC);		BIND(V, KeyV);
		BIND(B, KeyB);		BIND(N, KeyN);		BIND(M, KeyM);

		BIND(F1, KeyF1);	BIND(F2, KeyF2);	BIND(F3, KeyF3);	BIND(F4, KeyF4);	BIND(F5, KeyF5);

		BIND(F12, KeyStop);
		BIND(F10, KeyDelete);		BIND(F9, KeyInsert);		BIND(F8, KeyHome);
		BIND(Delete, KeyDelete);	BIND(Insert, KeyInsert);	BIND(Home, KeyHome);

		BIND(Escape, KeyEscape);
		BIND(Tab, KeyTab);			BIND(CapsLock, KeyCaps);

		BIND(LeftControl, KeyControl);	BIND(RightControl, KeyControl);
		BIND(LeftShift, KeyShift);		BIND(RightShift, KeyShift);
		BIND(LeftMeta, KeyCode);		BIND(RightMeta, KeyGraph);
		BIND(LeftOption, KeyCode);		BIND(RightOption, KeySelect);

		BIND(Semicolon, KeySemicolon);
		BIND(Quote, KeyQuote);
		BIND(OpenSquareBracket, KeyLeftSquareBracket);
		BIND(CloseSquareBracket, KeyRightSquareBracket);
		BIND(Hyphen, KeyMinus);
		BIND(Equals, KeyEquals);
		BIND(Left, KeyLeft);
		BIND(Right, KeyRight);
		BIND(Up, KeyUp);
		BIND(Down, KeyDown);
		BIND(FullStop, KeyFullStop);
		BIND(Comma, KeyComma);
		BIND(ForwardSlash, KeyForwardSlash);
		BIND(Backslash, KeyBackSlash);
		BIND(BackTick, KeyGrave);

		BIND(Enter, KeyEnter);
		BIND(Space, KeySpace);
		BIND(Backspace, KeyBackspace);

		default: break;
	}
#undef BIND
	return MachineTypes::MappedKeyboardMachine::KeyNotMapped;
}